

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

slist * gen_load_absoffsetrel
                  (compiler_state_t *cstate,bpf_abs_offset *abs_offset,u_int offset,u_int size)

{
  slist *s1;
  slist *s2;
  slist *s;
  u_int size_local;
  u_int offset_local;
  bpf_abs_offset *abs_offset_local;
  compiler_state_t *cstate_local;
  
  s2 = gen_abs_offset_varpart(cstate,abs_offset);
  if (s2 == (slist *)0x0) {
    s2 = new_stmt(cstate,size | 0x20);
    (s2->s).k = abs_offset->constant_part + offset;
  }
  else {
    s1 = new_stmt(cstate,size | 0x40);
    (s1->s).k = abs_offset->constant_part + offset;
    sappend(s2,s1);
  }
  return s2;
}

Assistant:

static struct slist *
gen_load_absoffsetrel(compiler_state_t *cstate, bpf_abs_offset *abs_offset,
    u_int offset, u_int size)
{
	struct slist *s, *s2;

	s = gen_abs_offset_varpart(cstate, abs_offset);

	/*
	 * If "s" is non-null, it has code to arrange that the X register
	 * contains the variable part of the absolute offset, so we
	 * generate a load relative to that, with an offset of
	 * abs_offset->constant_part + offset.
	 *
	 * Otherwise, we can do an absolute load with an offset of
	 * abs_offset->constant_part + offset.
	 */
	if (s != NULL) {
		/*
		 * "s" points to a list of statements that puts the
		 * variable part of the absolute offset into the X register.
		 * Do an indirect load, to use the X register as an offset.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_IND|size);
		s2->s.k = abs_offset->constant_part + offset;
		sappend(s, s2);
	} else {
		/*
		 * There is no variable part of the absolute offset, so
		 * just do an absolute load.
		 */
		s = new_stmt(cstate, BPF_LD|BPF_ABS|size);
		s->s.k = abs_offset->constant_part + offset;
	}
	return s;
}